

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

void formatInputMethodEvent(QDebug *d,QInputMethodEvent *e)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  QDebug *o_00;
  QInputMethodEvent *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QList<QInputMethodEvent::Attribute> attributes;
  QList<QInputMethodEvent::Attribute> *in_stack_ffffffffffffff68;
  char t;
  QList<QInputMethodEvent::Attribute> *in_stack_ffffffffffffff70;
  QString *s;
  QDebug in_stack_ffffffffffffff90;
  QDebug local_68;
  Attribute *local_60;
  QDebug local_58;
  QDebug local_50;
  char *in_stack_ffffffffffffffb8;
  const_iterator t_00;
  const_iterator local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = in_RDI;
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffffb8);
  QInputMethodEvent::preeditString(in_RSI);
  bVar1 = QString::isEmpty((QString *)0x351d25);
  if (!bVar1) {
    QDebug::operator<<((QDebug *)s,in_stack_ffffffffffffffb8);
    QDebug::QDebug(&local_10,(QDebug *)in_RDI);
    QInputMethodEvent::preeditString(in_RSI);
    formatUnicodeString((QDebug *)in_stack_ffffffffffffff90.stream,s);
    QDebug::~QDebug(&local_10);
  }
  QInputMethodEvent::commitString(in_RSI);
  bVar1 = QString::isEmpty((QString *)0x351d85);
  if (!bVar1) {
    QDebug::operator<<((QDebug *)s,in_stack_ffffffffffffffb8);
    QDebug::QDebug(&local_18,(QDebug *)in_RDI);
    QInputMethodEvent::commitString(in_RSI);
    formatUnicodeString((QDebug *)in_stack_ffffffffffffff90.stream,s);
    QDebug::~QDebug(&local_18);
  }
  iVar2 = QInputMethodEvent::replacementLength(in_RSI);
  if (iVar2 != 0) {
    in_stack_ffffffffffffff68 =
         (QList<QInputMethodEvent::Attribute> *)
         QDebug::operator<<((QDebug *)s,in_stack_ffffffffffffffb8);
    QInputMethodEvent::replacementStart(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,
                       (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    in_stack_ffffffffffffff70 =
         (QList<QInputMethodEvent::Attribute> *)
         QDebug::operator<<((QDebug *)s,in_stack_ffffffffffffffb8);
    QInputMethodEvent::replacementLength(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,
                       (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  }
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QInputMethodEvent::attributes(in_RSI);
  QList<QInputMethodEvent::Attribute>::QList(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_38.i = (Attribute *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QInputMethodEvent::Attribute>::cbegin(in_stack_ffffffffffffff70);
  o = QList<QInputMethodEvent::Attribute>::cend(in_stack_ffffffffffffff70);
  t_00 = o;
  bVar1 = QList<QInputMethodEvent::Attribute>::const_iterator::operator!=(&local_38,o);
  t = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  if (bVar1) {
    QDebug::operator<<((QDebug *)s,(char *)t_00.i);
    QDebug::QDebug(&local_58,(QDebug *)in_RDI);
    QList<QInputMethodEvent::Attribute>::const_iterator::operator*(&local_38);
    operator<<((QDebug *)s,(Attribute *)in_RSI);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QList<QInputMethodEvent::Attribute>::const_iterator::operator++(&local_38);
    while( true ) {
      local_60 = o.i;
      bVar1 = QList<QInputMethodEvent::Attribute>::const_iterator::operator!=(&local_38,o);
      t = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
      if (!bVar1) break;
      o_00 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,t);
      QDebug::QDebug((QDebug *)&stack0xffffffffffffff90,o_00);
      QList<QInputMethodEvent::Attribute>::const_iterator::operator*(&local_38);
      operator<<((QDebug *)s,(Attribute *)in_RSI);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff90);
      QList<QInputMethodEvent::Attribute>::const_iterator::operator++(&local_38);
    }
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,t);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,t);
  QList<QInputMethodEvent::Attribute>::~QList((QList<QInputMethodEvent::Attribute> *)0x351fc2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void formatInputMethodEvent(QDebug d, const QInputMethodEvent *e)
{
    d << "QInputMethodEvent(";
    if (!e->preeditString().isEmpty()) {
        d << "preedit=";
        formatUnicodeString(d, e->preeditString());
    }
    if (!e->commitString().isEmpty()) {
        d << ", commit=";
        formatUnicodeString(d, e->commitString());
    }
    if (e->replacementLength()) {
        d << ", replacementStart=" << e->replacementStart() << ", replacementLength="
          << e->replacementLength();
    }
    const auto attributes = e->attributes();
    auto it = attributes.cbegin();
    const auto end = attributes.cend();
    if (it != end) {
        d << ", attributes= {";
        d << *it;
        ++it;
        for (; it != end; ++it)
            d << ',' << *it;
        d << '}';
    }
    d << ')';
}